

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O3

ssize_t __thiscall Pl_SHA2::write(Pl_SHA2 *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  Pipeline *pPVar2;
  int iVar3;
  ssize_t in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar4;
  undefined4 in_register_00000034;
  long lVar5;
  void *pvVar6;
  
  if (this->in_progress == false) {
    this->in_progress = true;
  }
  pvVar4 = __buf;
  lVar5 = CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    do {
      pvVar6 = (void *)0x40000000;
      if (pvVar4 < (void *)0x40000000) {
        pvVar6 = pvVar4;
      }
      peVar1 = (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar3 = (*peVar1->_vptr_QPDFCryptoImpl[8])(peVar1,lVar5,pvVar6);
      in_RAX = CONCAT44(extraout_var,iVar3);
      pvVar4 = (void *)((long)pvVar4 - (long)pvVar6);
      lVar5 = lVar5 + (long)pvVar6;
    } while (pvVar4 != (void *)0x0);
  }
  pPVar2 = (this->super_Pipeline).next_;
  if (pPVar2 == (Pipeline *)0x0) {
    return in_RAX;
  }
  iVar3 = (*pPVar2->_vptr_Pipeline[2])(pPVar2,CONCAT44(in_register_00000034,__fd),__buf);
  return CONCAT44(extraout_var_00,iVar3);
}

Assistant:

void
Pl_SHA2::write(unsigned char const* buf, size_t len)
{
    if (!this->in_progress) {
        this->in_progress = true;
    }

    // Write in chunks in case len is too big to fit in an int. Assume int is at least 32 bits.
    static size_t const max_bytes = 1 << 30;
    size_t bytes_left = len;
    unsigned char const* data = buf;
    while (bytes_left > 0) {
        size_t bytes = (bytes_left >= max_bytes ? max_bytes : bytes_left);
        this->crypto->SHA2_update(data, bytes);
        bytes_left -= bytes;
        data += bytes;
    }

    if (next()) {
        next()->write(buf, len);
    }
}